

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

void Cec_ManPatStore(Cec_ManPat_t *p,Vec_Int_t *vPat)

{
  int iVar1;
  int Num;
  long lVar2;
  
  if (vPat->nSize < 1) {
    __assert_fail("Vec_IntSize(vPat) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                  ,0x5a,"void Cec_ManPatStore(Cec_ManPat_t *, Vec_Int_t *)");
  }
  Cec_ManPatStoreNum(p,vPat->nSize);
  if (0 < vPat->nSize) {
    Num = *vPat->pArray;
    Cec_ManPatStoreNum(p,Num);
    if (1 < vPat->nSize) {
      lVar2 = 1;
      do {
        iVar1 = vPat->pArray[lVar2];
        if (iVar1 - Num == 0 || iVar1 < Num) {
          __assert_fail("NumberPrev < Number",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                        ,0x60,"void Cec_ManPatStore(Cec_ManPat_t *, Vec_Int_t *)");
        }
        Cec_ManPatStoreNum(p,iVar1 - Num);
        lVar2 = lVar2 + 1;
        Num = iVar1;
      } while (lVar2 < vPat->nSize);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void Cec_ManPatStore( Cec_ManPat_t * p, Vec_Int_t * vPat )
{
    int i, Number, NumberPrev;
    assert( Vec_IntSize(vPat) > 0 );
    Cec_ManPatStoreNum( p, Vec_IntSize(vPat) );
    NumberPrev = Vec_IntEntry( vPat, 0 );
    Cec_ManPatStoreNum( p, NumberPrev );
    Vec_IntForEachEntryStart( vPat, Number, i, 1 )
    {
        assert( NumberPrev < Number );
        Cec_ManPatStoreNum( p, Number - NumberPrev );
        NumberPrev = Number;
    }
}